

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprSimplifiedAndOr(Expr *pExpr)

{
  u8 uVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  
  uVar1 = pExpr->op;
  if ((byte)(uVar1 - 0x2b) < 2) {
    pEVar2 = sqlite3ExprSimplifiedAndOr(pExpr->pRight);
    pEVar3 = sqlite3ExprSimplifiedAndOr(pExpr->pLeft);
    if (((pEVar3->flags & 0x10000001) == 0x10000000) || ((pEVar2->flags & 0x20000001) == 0x20000000)
       ) {
      pExpr = pEVar3;
      if (uVar1 == ',') {
        pExpr = pEVar2;
      }
    }
    else if ((((pEVar3->flags & 0x20000001) == 0x20000000) ||
             ((pEVar2->flags & 0x10000001) == 0x10000000)) && (pExpr = pEVar2, uVar1 == ',')) {
      pExpr = pEVar3;
    }
  }
  return pExpr;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSimplifiedAndOr(Expr *pExpr){
  assert( pExpr!=0 );
  if( pExpr->op==TK_AND || pExpr->op==TK_OR ){
    Expr *pRight = sqlite3ExprSimplifiedAndOr(pExpr->pRight);
    Expr *pLeft = sqlite3ExprSimplifiedAndOr(pExpr->pLeft);
    if( ExprAlwaysTrue(pLeft) || ExprAlwaysFalse(pRight) ){
      pExpr = pExpr->op==TK_AND ? pRight : pLeft;
    }else if( ExprAlwaysTrue(pRight) || ExprAlwaysFalse(pLeft) ){
      pExpr = pExpr->op==TK_AND ? pLeft : pRight;
    }
  }
  return pExpr;
}